

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
::transfer_n(btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
             *this,size_type n,size_type dest_i,size_type src_i,
            btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
            *src_node,allocator_type *alloc)

{
  btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *pbVar1;
  undefined8 uVar2;
  btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *pbVar3;
  btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *pbVar4;
  btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *pbVar5;
  long lVar6;
  
  if ((((ulong)src_node & 7) == 0) && (((ulong)this & 7) == 0)) {
    if (n != 0) {
      lVar6 = n << 5;
      pbVar1 = this + dest_i * 0x20;
      pbVar5 = src_node + src_i * 0x20;
      do {
        pbVar4 = pbVar5 + 0x20;
        pbVar3 = pbVar1 + 0x20;
        *(btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
          **)(pbVar1 + 0x10) = pbVar3;
        if (pbVar4 == *(btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                        **)(pbVar5 + 0x10)) {
          uVar2 = *(undefined8 *)(pbVar5 + 0x28);
          *(undefined8 *)pbVar3 = *(undefined8 *)pbVar4;
          *(undefined8 *)(pbVar1 + 0x28) = uVar2;
        }
        else {
          *(btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
            **)(pbVar1 + 0x10) =
               *(btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                 **)(pbVar5 + 0x10);
          *(undefined8 *)pbVar3 = *(undefined8 *)pbVar4;
        }
        *(undefined8 *)(pbVar1 + 0x18) = *(undefined8 *)(pbVar5 + 0x18);
        *(btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
          **)(pbVar5 + 0x10) = pbVar4;
        *(undefined8 *)(pbVar5 + 0x18) = 0;
        *pbVar4 = (btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                   )0x0;
        lVar6 = lVar6 + -0x20;
        pbVar1 = pbVar3;
        pbVar5 = pbVar4;
      } while (lVar6 != 0);
    }
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *, unsigned int, unsigned char, std::basic_string<char>, absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 7, 8>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *, unsigned int, unsigned char, std::basic_string<char>, absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string<char>, std::less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 7, 8>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 3UL, Char = char]"
               );
}

Assistant:

void transfer_n(const size_type n, const size_type dest_i,
                  const size_type src_i, btree_node *src_node,
                  allocator_type *alloc) {
    next_generation();
    for (slot_type *src = src_node->slot(src_i), *end = src + n,
                   *dest = slot(dest_i);
         src != end; ++src, ++dest) {
      transfer(dest, src, alloc);
    }
  }